

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

string * __thiscall
boost::deflate::inflate_stream_test::check_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,IDecompressor *d,
          initializer_list<unsigned_char> *in,error_code expected,wrap wrap,size_t window_size,
          size_t len)

{
  ulong_long_type uVar1;
  bool cond;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  system_error_category *extraout_RDX;
  _func_int **pp_Var5;
  size_type sVar6;
  system_error_category *psVar7;
  ulong uVar8;
  undefined3 in_stack_00000009;
  int local_38;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\0');
  (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[1])
            (this,(ulong)_wrap,(ulong)expected.cat_ & 0xffffffff);
  (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[5])
            (this,d->_vptr_IDecompressor);
  (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[9])
            (this,(__return_storage_ptr__->_M_dataplus)._M_p);
  pp_Var5 = d[1]._vptr_IDecompressor;
  if (window_size <= d[1]._vptr_IDecompressor) {
    pp_Var5 = (_func_int **)window_size;
  }
  (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[3])(this,pp_Var5);
  sVar6 = __return_storage_ptr__->_M_string_length;
  psVar7 = &system::detail::cat_holder<void>::system_category_instance;
  uVar4 = 0;
  lVar3 = 0x38;
  while( true ) {
    (**(code **)((long)(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor + lVar3))
              (this,sVar6);
    iVar2 = (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[2])(this);
    if ((CONCAT44(extraout_var,iVar2) == 0) || ((uVar4 & 0x100000000) != 0)) break;
    iVar2 = (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[10])(this,3);
    uVar4 = CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[2])(this);
    uVar8 = CONCAT44(extraout_var_01,iVar2);
    if (window_size <= CONCAT44(extraout_var_01,iVar2)) {
      uVar8 = window_size;
    }
    iVar2 = (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[4])(this);
    (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[5])
              (this,CONCAT44(extraout_var_02,iVar2) + uVar8);
    iVar2 = (*(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor[2])(this);
    sVar6 = CONCAT44(extraout_var_03,iVar2) - uVar8;
    lVar3 = 0x18;
    psVar7 = extraout_RDX;
  }
  local_38 = (int)in;
  if ((int)uVar4 == local_38) {
    uVar1 = ((expected._0_8_)->super_error_category).id_;
    cond = (psVar7->super_error_category).id_ == uVar1;
    if (uVar1 == 0) {
      cond = psVar7 == expected._0_8_;
    }
  }
  else {
    cond = false;
  }
  test_suite::detail::runner::maybe_fail<bool>
            (test_suite::detail::current()::p,cond,"ec == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x23c,
             "static std::string boost::deflate::inflate_stream_test::check(IDecompressor &, const std::initializer_list<std::uint8_t> &, error_code, wrap, std::size_t, std::size_t)"
             ,(char *)0x0);
  return __return_storage_ptr__;
}

Assistant:

static
    std::string check(IDecompressor& d,
                      std::initializer_list<std::uint8_t> const& in,
                      error_code expected,
                      wrap wrap =boost::deflate::wrap::none,
                      std::size_t window_size = 15,
                      std::size_t len = -1)
    {
        std::string out(1024, 0);
        d.init(static_cast<int>(window_size), wrap);
        error_code ec;

        d.next_in(&*in.begin());
        d.next_out(&out[0]);
        d.avail_in(std::min(in.size(), len));
        d.avail_out(out.size());

        while (d.avail_in() > 0 && !ec)
        {
            ec = d.write(Flush::sync);
            auto n = std::min(d.avail_in(), len);
            d.next_in(static_cast<char const*>(d.next_in()) + n);
            d.avail_in(d.avail_in() - n);
        }

        BOOST_TEST(ec == expected);
        return out;
    }